

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDress.c
# Opt level: O1

void Abc_NtkDress(Abc_Ntk_t *pNtkLogic,char *pFileName,int fVerbose)

{
  void *pvVar1;
  Abc_Obj_t *pObj;
  long *plVar2;
  Io_FileType_t FileType;
  int iVar3;
  uint uVar4;
  Abc_Ntk_t *pNtk;
  Abc_Ntk_t *pNtk2;
  Abc_Ntk_t *pNtk1;
  stmm_table *table;
  Vec_Ptr_t *pVVar5;
  uint uVar6;
  long lVar7;
  char *pcVar8;
  Abc_Obj_t *pNodeMap;
  ulong local_58;
  char *local_50;
  uint local_48;
  int local_44;
  Abc_Ntk_t *local_40;
  char *local_38;
  
  if (pNtkLogic->ntkType != ABC_NTK_LOGIC) {
    __assert_fail("Abc_NtkIsLogic(pNtkLogic)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcDress.c"
                  ,0x39,"void Abc_NtkDress(Abc_Ntk_t *, char *, int)");
  }
  FileType = Io_ReadFileType(pFileName);
  pNtk = Io_ReadNetlist(pFileName,FileType,1);
  if (pNtk != (Abc_Ntk_t *)0x0) {
    if (pNtk->ntkType != ABC_NTK_NETLIST) {
      __assert_fail("Abc_NtkIsNetlist(pNtkOrig)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcDress.c"
                    ,0x3f,"void Abc_NtkDress(Abc_Ntk_t *, char *, int)");
    }
    Abc_NtkCleanCopy(pNtkLogic);
    Abc_NtkCleanCopy(pNtk);
    pNtk2 = Abc_NtkToLogic(pNtk);
    iVar3 = Abc_NtkCompareSignals(pNtkLogic,pNtk2,1,1);
    if (iVar3 == 0) {
      Abc_NtkDelete(pNtk);
      Abc_NtkDelete(pNtk2);
      return;
    }
    pNtk1 = Abc_NtkStrash(pNtkLogic,1,0,0);
    Abc_NtkAppend(pNtk1,pNtk2,1);
    Abc_NtkTransferCopy(pNtk);
    Abc_NtkDelete(pNtk2);
    if (fVerbose != 0) {
      puts("After mitering:");
      uVar6 = pNtkLogic->nObjCounts[7];
      uVar4 = Abc_NtkCountCopy(pNtkLogic);
      printf("Logic:  Nodes = %5d. Copy = %5d. \n",(ulong)uVar6,(ulong)uVar4);
      uVar6 = pNtk->nObjCounts[7];
      uVar4 = Abc_NtkCountCopy(pNtk);
      printf("Orig:   Nodes = %5d. Copy = %5d. \n",(ulong)uVar6,(ulong)uVar4);
    }
    local_40 = Abc_NtkIvyFraig(pNtk1,100,1,0,1,0);
    Abc_NtkTransferCopy(pNtkLogic);
    Abc_NtkTransferCopy(pNtk);
    Abc_NtkDelete(pNtk1);
    if (fVerbose != 0) {
      puts("After fraiging:");
      uVar6 = pNtkLogic->nObjCounts[7];
      uVar4 = Abc_NtkCountCopy(pNtkLogic);
      printf("Logic:  Nodes = %5d. Copy = %5d. \n",(ulong)uVar6,(ulong)uVar4);
      uVar6 = pNtk->nObjCounts[7];
      uVar4 = Abc_NtkCountCopy(pNtk);
      printf("Orig:   Nodes = %5d. Copy = %5d. \n",(ulong)uVar6,(ulong)uVar4);
    }
    local_44 = fVerbose;
    if (pNtk->ntkType != ABC_NTK_NETLIST) {
      __assert_fail("Abc_NtkIsNetlist(pNtk)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcDress.c"
                    ,0x87,"stmm_table *Abc_NtkDressDeriveMapping(Abc_Ntk_t *)");
    }
    table = stmm_init_table(stmm_ptrcmp,stmm_ptrhash);
    pVVar5 = pNtk->vObjs;
    if (0 < pVVar5->nSize) {
      lVar7 = 0;
      do {
        pvVar1 = pVVar5->pArray[lVar7];
        if ((pvVar1 != (void *)0x0) && ((*(uint *)((long)pvVar1 + 0x14) & 0xf) == 7)) {
          pcVar8 = (char *)(*(ulong *)((long)pvVar1 + 0x40) & 0xfffffffffffffffe);
          iVar3 = stmm_lookup(table,pcVar8,(char **)0x0);
          if (iVar3 == 0) {
            stmm_insert(table,pcVar8,
                        (char *)((ulong)((uint)*(undefined8 *)((long)pvVar1 + 0x40) & 1) ^
                                (ulong)pvVar1));
          }
        }
        lVar7 = lVar7 + 1;
        pVVar5 = pNtk->vObjs;
      } while (lVar7 < pVVar5->nSize);
    }
    if (pNtkLogic->ntkType != ABC_NTK_LOGIC) {
      __assert_fail("Abc_NtkIsLogic(pNtk)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcDress.c"
                    ,0xa8,"void Abc_NtkDressTransferNames(Abc_Ntk_t *, stmm_table *, int)");
    }
    local_48 = table->num_entries;
    pVVar5 = pNtkLogic->vObjs;
    if (pVVar5->nSize < 1) {
      local_58 = 0;
      uVar6 = 0;
    }
    else {
      lVar7 = 0;
      uVar6 = 0;
      local_58 = 0;
      do {
        pObj = (Abc_Obj_t *)pVVar5->pArray[lVar7];
        if (((pObj != (Abc_Obj_t *)0x0) && ((*(uint *)&pObj->field_0x14 & 0xf) == 7)) &&
           (pcVar8 = Nm_ManFindNameById(pNtkLogic->pManName,pObj->Id), pcVar8 == (char *)0x0)) {
          local_38 = (char *)((ulong)(pObj->field_6).pTemp & 0xfffffffffffffffe);
          iVar3 = stmm_lookup(table,local_38,&local_50);
          if (iVar3 != 0) {
            plVar2 = *(long **)(*(long *)(*(long *)(*(long *)((ulong)local_50 & 0xfffffffffffffffe)
                                                   + 0x20) + 8) +
                               (long)*(int *)((long *)((ulong)local_50 & 0xfffffffffffffffe))[6] * 8
                               );
            local_50 = (char *)((ulong)((pObj->field_6).iTemp & 1) ^ (ulong)local_50);
            pcVar8 = Nm_ManFindNameById(*(Nm_Man_t **)(*plVar2 + 0x18),(int)plVar2[2]);
            if (pcVar8 == (char *)0x0) {
              __assert_fail("pName != NULL",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcDress.c"
                            ,0xb9,"void Abc_NtkDressTransferNames(Abc_Ntk_t *, stmm_table *, int)");
            }
            if (((ulong)local_50 & 1) == 0) {
              Abc_ObjAssignName(pObj,pcVar8,(char *)0x0);
              local_58 = (ulong)((int)local_58 + 1);
            }
            else {
              Abc_ObjAssignName(pObj,pcVar8,"_inv");
              uVar6 = uVar6 + 1;
            }
            stmm_delete(table,&local_38,&local_50);
          }
        }
        lVar7 = lVar7 + 1;
        pVVar5 = pNtkLogic->vObjs;
      } while (lVar7 < pVVar5->nSize);
    }
    if (local_44 != 0) {
      printf("Total number of names collected = %5d.\n",(ulong)local_48);
      printf("Total number of names assigned  = %5d. (Dir = %5d. Compl = %5d.)\n",
             (ulong)((int)local_58 + uVar6),local_58,(ulong)uVar6);
    }
    stmm_free_table(table);
    Abc_NtkDelete(local_40);
    Abc_NtkDelete(pNtk);
  }
  return;
}

Assistant:

void Abc_NtkDress( Abc_Ntk_t * pNtkLogic, char * pFileName, int fVerbose )
{
    Abc_Ntk_t * pNtkOrig, * pNtkLogicOrig;
    Abc_Ntk_t * pMiter, * pMiterFraig;
    stmm_table * tMapping;

    assert( Abc_NtkIsLogic(pNtkLogic) );

    // get the original netlist
    pNtkOrig = Io_ReadNetlist( pFileName, Io_ReadFileType(pFileName), 1 );
    if ( pNtkOrig == NULL )
        return;
    assert( Abc_NtkIsNetlist(pNtkOrig) );

    Abc_NtkCleanCopy(pNtkLogic);
    Abc_NtkCleanCopy(pNtkOrig);

    // convert it into the logic network
    pNtkLogicOrig = Abc_NtkToLogic( pNtkOrig );
    // check that the networks have the same PIs/POs/latches
    if ( !Abc_NtkCompareSignals( pNtkLogic, pNtkLogicOrig, 1, 1 ) )
    {
        Abc_NtkDelete( pNtkOrig );
        Abc_NtkDelete( pNtkLogicOrig );
        return;
    }

    // convert the current logic network into an AIG
    pMiter = Abc_NtkStrash( pNtkLogic, 1, 0, 0 );

    // convert it into the AIG and make the netlist point to the AIG
    Abc_NtkAppend( pMiter, pNtkLogicOrig, 1 );
    Abc_NtkTransferCopy( pNtkOrig );
    Abc_NtkDelete( pNtkLogicOrig );

if ( fVerbose ) 
{
printf( "After mitering:\n" );
printf( "Logic:  Nodes = %5d. Copy = %5d. \n", Abc_NtkNodeNum(pNtkLogic), Abc_NtkCountCopy(pNtkLogic) );
printf( "Orig:   Nodes = %5d. Copy = %5d. \n", Abc_NtkNodeNum(pNtkOrig),  Abc_NtkCountCopy(pNtkOrig) );
}

    // fraig the miter (miter nodes point to the fraiged miter)
    pMiterFraig = Abc_NtkIvyFraig( pMiter, 100, 1, 0, 1, 0 );
    // make netlists point to the fraiged miter
    Abc_NtkTransferCopy( pNtkLogic );
    Abc_NtkTransferCopy( pNtkOrig );
    Abc_NtkDelete( pMiter );

if ( fVerbose ) 
{
printf( "After fraiging:\n" );
printf( "Logic:  Nodes = %5d. Copy = %5d. \n", Abc_NtkNodeNum(pNtkLogic), Abc_NtkCountCopy(pNtkLogic) );
printf( "Orig:   Nodes = %5d. Copy = %5d. \n", Abc_NtkNodeNum(pNtkOrig),  Abc_NtkCountCopy(pNtkOrig) );
}

    // derive mapping from the fraiged nodes into their prototype nodes in the original netlist
    tMapping = Abc_NtkDressDeriveMapping( pNtkOrig );

    // transfer the names to the new netlist
    Abc_NtkDressTransferNames( pNtkLogic, tMapping, fVerbose );

    // clean up
    stmm_free_table( tMapping );
    Abc_NtkDelete( pMiterFraig );
    Abc_NtkDelete( pNtkOrig );
}